

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_acolyte.cpp
# Opt level: O0

int AF_A_AcolyteDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  MetaClass *pMVar1;
  bool bVar2;
  bool local_82;
  bool local_7f;
  FSoundID local_7c;
  AActor *local_78;
  AActor *other;
  TThinkerIterator<AActor> iterator;
  int i;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                  ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                  ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_7f = true;
  if (this != (AActor *)0x0) {
    local_7f = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_7f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                  ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                    ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_82 = true;
    if (this_00 != (DObject *)0x0) {
      local_82 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_82 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                    ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                    ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  FRenderStyle::operator=((FRenderStyle *)&(this->RenderStyle).field_0,STYLE_Normal);
  pMVar1 = AActor::GetClass(this);
  bVar2 = FName::operator!=(&(pMVar1->super_PClass).super_PStruct.super_PNamedType.TypeName,
                            NAME_AcolyteBlue);
  if (!bVar2) {
    iterator.super_FThinkerIterator._20_4_ = 0;
    while (((int)iterator.super_FThinkerIterator._20_4_ < 8 &&
           (((playeringame[(int)iterator.super_FThinkerIterator._20_4_] & 1U) == 0 ||
            ((int)(&DAT_00d634f8)[(long)(int)iterator.super_FThinkerIterator._20_4_ * 0xa8] < 1)))))
    {
      iterator.super_FThinkerIterator._20_4_ = iterator.super_FThinkerIterator._20_4_ + 1;
    }
    if (iterator.super_FThinkerIterator._20_4_ != 8) {
      TThinkerIterator<AActor>::TThinkerIterator
                ((TThinkerIterator<AActor> *)&other,NAME_AcolyteBlue,0x80);
      do {
        local_78 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&other);
        if (local_78 == (AActor *)0x0) {
          AActor::GiveInventoryType
                    ((AActor *)(&players)[(long)(int)iterator.super_FThinkerIterator._20_4_ * 0x54],
                     QuestItemClasses[6]);
          player_t::SetLogNumber
                    ((player_t *)
                     (&players + (long)(int)iterator.super_FThinkerIterator._20_4_ * 0x54),0xe);
          S_StopSound(2);
          FSoundID::FSoundID(&local_7c,"svox/voc14");
          S_Sound(2,&local_7c,1.0,1.0);
          return 0;
        }
      } while ((local_78 == this) || (local_78->health < 1));
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_AcolyteDie)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	// [RH] Disable translucency here.
	self->RenderStyle = STYLE_Normal;

	// Only the Blue Acolyte does extra stuff on death.
	if (self->GetClass()->TypeName != NAME_AcolyteBlue)
		return 0;

	// Make sure somebody is still alive
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].health > 0)
			break;
	}
	if (i == MAXPLAYERS)
		return 0;

	// Make sure all the other blue acolytes are dead.
	TThinkerIterator<AActor> iterator(NAME_AcolyteBlue);
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != self && other->health > 0)
		{ // Found a living one
			return 0;
		}
	}

	players[i].mo->GiveInventoryType (QuestItemClasses[6]);
	players[i].SetLogNumber (14);
	S_StopSound (CHAN_VOICE);
	S_Sound (CHAN_VOICE, "svox/voc14", 1, ATTN_NORM);
	return 0;
}